

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

double __thiscall sophia_interface::LUZDIS(sophia_interface *this,int KFL1,int KFL2,double PR)

{
  bool bVar1;
  double *pdVar2;
  int *piVar3;
  sophia_interface *psVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar5;
  double dVar6;
  double dVar7;
  __type _Var8;
  double dVar9;
  int local_f4;
  bool repeat110;
  double dStack_f0;
  double FC_1;
  double local_e0;
  double local_d8;
  double FVAL;
  double FEXP;
  double FPRE;
  double dStack_b8;
  bool repeat100;
  double local_b0;
  double FSCB;
  double ZDIVC;
  double FINT;
  double ZDIV;
  double dStack_88;
  int MMAX;
  int local_7c;
  double dStack_78;
  int MA;
  double ZMAX;
  double dStack_68;
  int MC;
  double FRED_1;
  double FRED;
  double FC;
  double FB;
  double FBB;
  double FA;
  int local_30;
  int KFLH;
  int KFLB;
  int KFLA;
  double Z;
  double PR_local;
  int KFL2_local;
  int KFL1_local;
  sophia_interface *this_local;
  
  _KFLB = 0.0;
  KFLH = KFL1;
  if (KFL1 < 1) {
    KFLH = -KFL1;
  }
  local_30 = KFL2;
  if (KFL2 < 1) {
    local_30 = -KFL2;
  }
  FA._4_4_ = KFLH;
  if (9 < KFLH) {
    FA._4_4_ = (int)((long)((ulong)(uint)((int)((long)KFLH / 1000) >> 0x1f) << 0x20 |
                           (long)KFLH / 1000 & 0xffffffffU) % 10);
  }
  Z = PR;
  PR_local._0_4_ = KFL2;
  PR_local._4_4_ = KFL1;
  _KFL2_local = this;
  if ((MSTJ[10] == 1) || (((MSTJ[10] == 3 && (FA._4_4_ < 4)) || (3 < MSTJ[10])))) {
    FBB = PARJ[0x28];
    if (MSTJ[0x5a] == 1) {
      FBB = PARJ[0x2a];
    }
    if (9 < local_30) {
      FBB = PARJ[0x2c] + FBB;
    }
    FB = PARJ[0x29];
    if (MSTJ[0x5a] == 1) {
      FB = PARJ[0x2b];
    }
    FC = FB * PR;
    FRED = 1.0;
    if (9 < KFLH) {
      FRED = 1.0 - PARJ[0x2c];
    }
    if (9 < local_30) {
      FRED = PARJ[0x2c] + FRED;
    }
    if (((MSTJ[10] < 4) || (FA._4_4_ < 4)) || (5 < FA._4_4_)) {
      if (((3 < MSTJ[10]) && (5 < FA._4_4_)) && (FA._4_4_ < 9)) {
        dStack_68 = PARJ[0x2d];
        if (MSTJ[10] == 5) {
          dStack_68 = PARJ[0x2f];
        }
        FRED = dStack_68 * FB * PMAS[0][FA._4_4_ + -1] * PMAS[0][FA._4_4_ + -1] + FRED;
      }
    }
    else {
      FRED_1 = PARJ[0x2d];
      if ((MSTJ[10] == 5) && (FA._4_4_ == 5)) {
        FRED_1 = PARJ[0x2e];
      }
      FRED = FRED_1 * FB * PARF[FA._4_4_ + 99] * PARF[FA._4_4_ + 99] + FRED;
    }
    ZMAX._4_4_ = 1;
    psVar4 = this;
    std::abs((int)this);
    if (0.01 < extraout_XMM0_Qa) {
      ZMAX._4_4_ = 2;
    }
    dStack_78 = 0.0;
    local_7c = 0;
    if (0.02 <= FBB) {
      std::abs((int)psVar4);
      if (0.01 <= extraout_XMM0_Qa_00) {
        local_7c = 3;
        dVar5 = FC + FRED;
        dVar6 = sqrt((FC - FRED) * (FC - FRED) + FBB * 4.0 * FC);
        dStack_78 = ((dVar5 - dVar6) * 0.5) / (FRED - FBB);
        if ((0.9999 < dStack_78) && (100.0 < FC)) {
          dStack_88 = 1.0 - FBB / FC;
          pdVar2 = std::min<double>(&stack0xffffffffffffff88,&stack0xffffffffffffff78);
          dStack_78 = *pdVar2;
        }
      }
      else {
        local_7c = 2;
        dStack_78 = FC / (FC + FRED);
      }
    }
    else {
      local_7c = 1;
      dStack_78 = 1.0;
      if (FC < FRED) {
        dStack_78 = FC / FRED;
      }
    }
    ZDIV._4_4_ = 2;
    FINT = 0.0;
    ZDIVC = 0.0;
    FSCB = 0.0;
    if (0.1 <= dStack_78) {
      if ((0.85 < dStack_78) && (1.0 < FC)) {
        ZDIV._4_4_ = 3;
        local_b0 = sqrt((FRED / FC) * (FRED / FC) + 4.0);
        dVar5 = local_b0 - 1.0 / dStack_78;
        dVar6 = FRED / FC;
        dVar7 = log(dStack_78 * 0.5 * (local_b0 + FRED / FC));
        FINT = -dVar6 * dVar7 + dVar5;
        if (1 < local_7c) {
          dVar5 = FBB / FC;
          dVar6 = log(1.0 - dStack_78);
          FINT = dVar5 * dVar6 + FINT;
        }
        dStack_b8 = 0.0;
        pdVar2 = std::max<double>(&stack0xffffffffffffff48,&FINT);
        pdVar2 = std::min<double>(&stack0xffffffffffffff88,pdVar2);
        FINT = *pdVar2;
        ZDIVC = FC * (1.0 - FINT) + 1.0;
      }
    }
    else {
      ZDIV._4_4_ = 1;
      FINT = dStack_78 * 2.75;
      if (ZMAX._4_4_ == 1) {
        dVar5 = log(FINT);
        ZDIVC = 1.0 - dVar5;
      }
      else {
        FSCB = pow(FINT,1.0 - FRED);
        ZDIVC = (1.0 - 1.0 / FSCB) / (FRED - 1.0) + 1.0;
      }
    }
    do {
      FPRE._7_1_ = 0;
      _KFLB = RLU(this,false);
      dVar5 = ZDIVC;
      FEXP = 1.0;
      if (ZDIV._4_4_ == 1) {
        dVar6 = RLU(this,false);
        if (1.0 < dVar5 * dVar6) {
          if (ZMAX._4_4_ == 1) {
            _KFLB = pow(FINT,_KFLB);
            FEXP = FINT / _KFLB;
          }
          else {
            _KFLB = pow(_KFLB * (1.0 - FSCB) + FSCB,1.0 / (1.0 - FRED));
            _KFLB = 1.0 / _KFLB;
            FEXP = pow(FINT / _KFLB,FRED);
          }
        }
        else {
          _KFLB = FINT * _KFLB;
        }
      }
      else if (ZDIV._4_4_ == 3) {
        dVar7 = RLU(this,false);
        dVar6 = FINT;
        if (1.0 < dVar5 * dVar7) {
          _KFLB = _KFLB * (1.0 - FINT) + FINT;
        }
        else {
          dVar5 = log(_KFLB);
          _KFLB = dVar6 + dVar5 / FC;
          FEXP = exp(FC * (_KFLB - FINT));
        }
      }
      dVar5 = FRED;
      if ((_KFLB <= 0.0) || (1.0 <= _KFLB)) {
        FPRE._7_1_ = 1;
      }
      else {
        dVar7 = log(dStack_78 / _KFLB);
        dVar6 = FBB;
        FVAL = dVar5 * dVar7 + FC * (1.0 / dStack_78 - 1.0 / _KFLB);
        if (1 < local_7c) {
          dVar5 = log((1.0 - _KFLB) / (1.0 - dStack_78));
          FVAL = dVar6 * dVar5 + FVAL;
        }
        local_e0 = -50.0;
        FC_1 = 50.0;
        pdVar2 = std::min<double>(&FC_1,&FVAL);
        pdVar2 = std::max<double>(&local_e0,pdVar2);
        dVar5 = exp(*pdVar2);
        local_d8 = dVar5;
        dVar6 = RLU(this,false);
        if (dVar5 < dVar6 * FEXP) {
          FPRE._7_1_ = 1;
        }
      }
    } while ((FPRE._7_1_ & 1) != 0);
  }
  else {
    local_f4 = 1;
    piVar3 = std::max<int>(&local_f4,(int *)((long)&FA + 4));
    dStack_f0 = PARJ[*piVar3 + 0x31];
    if (MSTJ[0x5a] == 1) {
      dStack_f0 = PARJ[0x3a];
    }
    do {
      bVar1 = false;
      _KFLB = RLU(this,false);
      dVar5 = dStack_f0;
      if ((dStack_f0 < 0.0) || (1.0 < dStack_f0)) {
        if ((dStack_f0 <= -1.0) || (0.0 <= dStack_f0)) {
          if (0.0 < dStack_f0) {
            _KFLB = pow(_KFLB,1.0 / dStack_f0);
            _KFLB = 1.0 - _KFLB;
          }
          if (dStack_f0 < 0.0) {
            _KFLB = pow(_KFLB,-1.0 / dStack_f0);
          }
        }
        else {
          dVar5 = dStack_f0 * -4.0 * _KFLB;
          dVar7 = 1.0 - _KFLB;
          dVar9 = 1.0 - _KFLB;
          dVar6 = RLU(this,false);
          _Var8 = std::pow<double,int>((1.0 - _KFLB) * (1.0 - _KFLB) + -(dStack_f0 * _KFLB),2);
          if (dVar5 * dVar7 * dVar9 < dVar6 * _Var8) {
            bVar1 = true;
          }
        }
      }
      else {
        dVar6 = RLU(this,false);
        if (dVar6 < dVar5) {
          _KFLB = pow(_KFLB,0.3333333333333333);
          _KFLB = 1.0 - _KFLB;
        }
      }
    } while (bVar1);
  }
  return _KFLB;
}

Assistant:

double sophia_interface::LUZDIS(int KFL1, int KFL2, double PR) {
// Purpose: to generate the longitudinal splitting variable Z.
    double Z = 0.;

    // Check if heavy flavour fragmentation. 
    int KFLA = std::abs(KFL1);
    int KFLB = std::abs(KFL2);
    int KFLH = KFLA;
    if (KFLA >= 10) KFLH = (KFLA / 1000) % 10;
 
    // Lund symmetric scaling function: determine parameters of shape. 
    if (MSTJ[10] == 1 || (MSTJ[10] == 3 && KFLH <= 3) || MSTJ[10] >= 4) {
        double FA = PARJ[40];
        if (MSTJ[90] == 1) FA = PARJ[42];
        if (KFLB >= 10) FA += PARJ[44];
        double FBB = PARJ[41];
        if (MSTJ[90] == 1) FBB = PARJ[43];
        double FB = FBB * PR;
        double FC = 1.;
        if (KFLA >= 10) FC -= PARJ[44];
        if (KFLB >= 10) FC += PARJ[44];
        if (MSTJ[10] >= 4 && KFLH >= 4 && KFLH <= 5) {
            double FRED = PARJ[45];
            if (MSTJ[10] == 5 && KFLH == 5) FRED = PARJ[46];
            FC += FRED * FBB * PARF[100 + KFLH - 1] * PARF[100 + KFLH - 1];
        } else if (MSTJ[10] >= 4 && KFLH >= 6 && KFLH <= 8) {
            double FRED = PARJ[45];
            if (MSTJ[10] == 5) FRED = PARJ[47];
            FC += FRED * FBB * PMAS[0][KFLH - 1] * PMAS[0][KFLH - 1];
        }
        int MC = 1;
        if (std::abs(FC - 1.) > 0.01) MC = 2;
 
        // Determine position of maximum. Special cases for a  =  0 or a  =  c. 
        double ZMAX = 0.;
        int MA = 0;
        if (FA < 0.02) {
            MA = 1;
            ZMAX = 1.;
            if (FC > FB) ZMAX = FB / FC;
        } else if (std::abs(FC-FA) < 0.01) {
            MA = 2;
            ZMAX = FB / (FB + FC);
        } else {
            MA = 3;
            ZMAX = 0.5 * (FB + FC - std::sqrt((FB - FC) * (FB - FC) + 4. * FA * FB)) / (FC - FA);
            if ((ZMAX > 0.9999) && (FB > 100.)) ZMAX = std::min(ZMAX, 1. - FA / FB);
        }
 
        // Subdivide z range if distribution very peaked near endpoint. 
        int MMAX = 2;
        double ZDIV = 0.;
        double FINT = 0.;
        double ZDIVC = 0.;
        if (ZMAX < 0.1) {
            MMAX = 1;
            ZDIV = 2.75 * ZMAX;
            if (MC == 1) {
                FINT = 1. - std::log(ZDIV);
            } else {
                ZDIVC = std::pow(ZDIV, 1. - FC);
                FINT = 1. + (1. - 1. / ZDIVC) / (FC - 1.);
            }
        } else if (ZMAX > 0.85 && FB > 1.) {
            MMAX = 3;
            double FSCB = std::sqrt(4. + (FC / FB) * (FC / FB));
            ZDIV = FSCB - 1. / ZMAX - (FC / FB) * std::log(ZMAX * 0.5 * (FSCB + FC / FB));
            if (MA >= 2) ZDIV += (FA / FB) * std::log(1. - ZMAX);
            ZDIV = std::min(ZMAX, std::max(0., ZDIV));
            FINT = 1. + FB * (1. - ZDIV);
        }

        // Choice of z, preweighted for peaks at low or high z.
        bool repeat100 = false;
        do {  // 100
            repeat100 = false;
            Z = RLU();
            double FPRE = 1.;
            if (MMAX == 1) {
                if (FINT * RLU() <= 1.) {
                    Z *= ZDIV;
                } else if (MC == 1) {
                    Z = std::pow(ZDIV, Z);
                    FPRE = ZDIV / Z;
                } else {
                    Z = 1. / std::pow(ZDIVC + Z * (1. - ZDIVC), 1. / (1. - FC));
                    FPRE = std::pow(ZDIV / Z, FC);
                }
            } else if (MMAX == 3) {
                if (FINT * RLU() <= 1.) {
                    Z = ZDIV + std::log(Z) / FB;
                    FPRE = std::exp(FB * (Z - ZDIV));
                } else {
                    Z = ZDIV + Z * (1. - ZDIV);
                }
            }

            // Weighting according to correct formula.
            if (Z <= 0. || Z >= 1.) {repeat100 = true; continue;}
            double FEXP = FC * std::log(ZMAX / Z) + FB * (1. / ZMAX - 1. / Z);
            if (MA >= 2) FEXP += FA * std::log((1. - Z) / (1. - ZMAX));
            double FVAL = std::exp(std::max(-50., std::min(50., FEXP)));
            if (FVAL < RLU() * FPRE) {repeat100 = true; continue;}
        } while (repeat100);

    // Generate z according to Field-Feynman, SLAC, (1-z)^c OR z^c.
    } else {
        double FC = PARJ[50 + std::max(1, KFLH) - 1];
        if (MSTJ[90] == 1) FC = PARJ[58];
        bool repeat110 = false;
        do {  // 110
            repeat110 = false;
            Z = RLU();
            if (FC >= 0. && FC <= 1.) {
                if (FC > RLU()) Z = 1. - std::pow(Z, 1. / 3.);
            } else if (FC > -1 && FC < 0.) {
                if (-4. * FC * Z * (1. - Z) * (1. - Z) < RLU() * std::pow((1. - Z) * (1. - Z) - FC * Z, 2)) {repeat110 = true; continue;}
            } else {
                if (FC > 0.) Z = 1. - std::pow(Z, (1. / FC));
                if (FC < 0.) Z = std::pow(Z, (-1. / FC));
            }
        } while (repeat110);
    }
    return Z;
}